

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O3

void __thiscall tst_helpers_connect::rejectOneSenderDestroyed(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  PromiseResolver<void> PVar2;
  char cVar3;
  bool bVar4;
  Object *this_00;
  Data *pDVar5;
  Data *pDVar6;
  QObject *pQVar7;
  QEvent *this_01;
  char *pcVar8;
  char *pcVar9;
  PromiseDataBase<void,_void_()> *this_02;
  PromiseData<int> *this_03;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> this_04;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar10;
  char *reject;
  QSharedData *pQVar11;
  bool local_139;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_138;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QStack_130;
  undefined **local_128;
  PromiseData<int> *local_120;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_108;
  PromiseResolver<int> resolver_1;
  bool local_f1;
  QSharedData *local_f0;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type p_Stack_d0;
  QSharedData *local_c0;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> p;
  QPromise<int> local_a8;
  PromiseResolver<void> resolver;
  _Manager_type local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Object *sender;
  
  this_00 = (Object *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->m_connections = 0;
  QObject::QObject((QObject *)this_00,(QObject *)0x0);
  *(undefined ***)this_00 = &PTR_metaObject_0012acd0;
  this_00->m_connections = 0;
  sender = this_00;
  pDVar5 = (Data *)QThread::currentThread();
  if ((pDVar5 != (Data *)0x0) &&
     (pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar5),
     local_138.d = pDVar6, QStack_130.d = (Data *)pDVar5, pDVar6 != (Data *)0x0)) {
    if ((*(int *)&pDVar6->field_0x4 != 0) && (cVar3 = QThread::isFinished(), cVar3 == '\0')) {
      if (*(int *)&pDVar6->field_0x4 == 0) {
        pDVar5 = (Data *)0x0;
      }
      pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pDVar5);
      if ((pQVar7 != (QObject *)0x0) || (cVar3 = QCoreApplication::closingDown(), cVar3 == '\0')) {
        this_01 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_01,None);
        *(undefined ***)this_01 = &PTR__Event_0012a4b0;
        *(Object ***)(this_01 + 0x10) = &sender;
        QCoreApplication::postEvent(pQVar7,this_01,0);
      }
    }
    LOCK();
    (pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      QVar10.d = local_138.d;
      if (local_138.d == (Data *)0x0) {
        QVar10.d = (Data *)0x0;
      }
      operator_delete(QVar10.d);
    }
  }
  QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
            ((Object *)&p,(offset_in_Object_to_subr)sender);
  this_04 = p.super_QPromiseBase<int>.m_d;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_138.d._0_1_ = bVar4;
  local_e8._M_pod_data[0] = 1;
  pcVar8 = QTest::toString<bool>((bool *)&local_138);
  pcVar9 = QTest::toString<bool>((bool *)local_e8._M_pod_data);
  reject = "p.isPending()";
  cVar3 = QTest::compare_helper
                    (bVar4,"Compared values are not the same",pcVar8,pcVar9,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x8b);
  if (cVar3 == '\0') goto LAB_0010952d;
  local_139 = false;
  pQVar11 = &((this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar1 = &((this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f0 = pQVar11;
  this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02->super_QSharedData = 0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_02->m_lock = 0;
  *(undefined8 *)&this_02->m_settled = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012a820;
  QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
  this_02->m_settled = false;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012a7a8;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c0 = &this_02->super_QSharedData;
  local_e8._M_unused._M_object = &PTR__QPromiseBase_0012a770;
  local_e8._8_8_ = this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e8);
  local_e8._M_unused._M_object = &PTR__QPromiseBase_0012a6e0;
  if ((PromiseDataBase<void,_void_()> *)local_e8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_e8._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_e8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_e8._8_8_ + 8))();
    }
  }
  PVar2.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_138.d = (Data *)0x0;
LAB_00108e63:
    QStack_130.d = (Data *)0x0;
    bVar4 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_138 = resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_00108e63;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_138 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    QStack_130 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar4 = false;
  }
  QVar10.d = QStack_130.d;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(Data **)local_58._M_unused._0_8_ = local_138.d;
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_58._M_unused._0_8_ + 8) = QStack_130.d;
  if (QStack_130.d == (Data *)0x0) {
    pcStack_40 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcStack_40 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if (QStack_130.d != (Data *)0x0) {
      LOCK();
      ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_130.d,0x10);
      }
    }
  }
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_138.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_138 = PVar2.m_d.d;
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar4) {
    LOCK();
    ((QVar10.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar10.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128 = (undefined **)&local_139;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  QStack_130.d = QVar10.d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(Data **)local_78._M_unused._0_8_ = local_138.d;
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 8) = QStack_130.d;
  if (QStack_130.d == (Data *)0x0) {
    *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_128;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_128;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if (QStack_130.d != (Data *)0x0) {
      LOCK();
      ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_130.d,0x10);
      }
    }
  }
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_138.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (!bVar4) {
    LOCK();
    ((QVar10.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar10.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar10.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar10.d,0x10);
    }
  }
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_03 = (PromiseData<int> *)operator_new(0x68);
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_03->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_03->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012aae8;
  QReadWriteLock::QReadWriteLock
            (&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_03->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012aa80;
  (this_03->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_03->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar11 = &(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar11 = &(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar11 = &(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012aa48;
  local_a8.super_QPromiseBase<int>.m_d.d = this_03;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,&local_a8);
  local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012a740;
  if (local_a8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_a8.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_a8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_a8.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_108.d = (Data *)0x0;
    local_110.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_108 = resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_110.d = (Data *)0x0;
LAB_00109247:
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      if (local_110.d == (Data *)0x0) goto LAB_0010925c;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_110 = resolver_1.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00109247;
    }
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_0010925c:
  local_120 = this_04.d;
  LOCK();
  pQVar1 = &((this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_128 = &PTR__QPromiseBase_0012aa48;
  local_e8._M_unused._M_object = (_func_int **)0x0;
  local_e8._8_8_ = (PromiseData<void> *)0x0;
  local_d8 = (_Manager_type)0x0;
  p_Stack_d0 = (_Invoker_type)0x0;
  local_138.d = (Data *)local_108.d;
  QStack_130.d = (Data *)local_110.d;
  local_e8._M_unused._M_object = operator_new(0x20);
  *(Data **)local_e8._M_unused._0_8_ = local_138.d;
  if ((Data *)local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_e8._M_unused._0_8_ + 8) = QStack_130.d;
  if ((Data *)QStack_130.d != (Data *)0x0) {
    LOCK();
    ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_e8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_0012a740;
  *(PromiseData<int> **)((long)local_e8._M_unused._0_8_ + 0x18) = local_120;
  if (local_120 == (PromiseData<int> *)0x0) {
    *(undefined ***)((long)local_e8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_0012aa48;
    p_Stack_d0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    local_128 = &PTR__QPromiseBase_0012a740;
  }
  else {
    LOCK();
    pQVar1 = &(local_120->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)local_e8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_0012aa48;
    p_Stack_d0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    local_128 = &PTR__QPromiseBase_0012a740;
    if (local_120 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(local_120->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_120 != (PromiseData<int> *)0x0)) {
        (*(local_120->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  pQVar1 = local_f0;
  if ((Data *)QStack_130.d != (Data *)0x0) {
    LOCK();
    ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_130.d,0x10);
    }
  }
  if ((Data *)local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_138.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_02,(function<void_()> *)&local_e8);
  if (local_d8 != (_Manager_type)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_108,
             (QPromiseResolve<int> *)&local_110,(QPromiseReject<void> *)reject);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_02,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (local_108.d != (Data *)0x0) {
    LOCK();
    ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_108.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_02);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
              (this_04.d);
  }
  LOCK();
  (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
              (this_04.d);
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_03);
  while (bVar4 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this_03);
  }
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_03->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_03);
  }
  LOCK();
  (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_03->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_03);
  }
  bVar4 = local_139;
  local_f1 = local_139;
  local_138.d._0_1_ = 1;
  pcVar8 = QTest::toString<bool>(&local_f1);
  pcVar9 = QTest::toString<bool>((bool *)&local_138);
  QTest::compare_helper
            (bVar4,"Compared values are not the same",pcVar8,pcVar9,
             "waitForRejected<QtPromise::QPromiseContextException>(p)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
             ,0x8c);
  this_04 = p.super_QPromiseBase<int>.m_d;
LAB_0010952d:
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012a740;
  if (this_04.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar11 = &((this_04.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderDestroyed()
{
    auto sender = new Object{};
    QtPromisePrivate::qtpromise_defer([&]() {
        sender->deleteLater();
    });

    auto p = QtPromise::connect(sender, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForRejected<QtPromise::QPromiseContextException>(p), true);
}